

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O0

void __thiscall
icu_63::LocaleKey::LocaleKey
          (LocaleKey *this,UnicodeString *primaryID,UnicodeString *canonicalPrimaryID,
          UnicodeString *canonicalFallbackID,int32_t kind)

{
  UBool UVar1;
  int32_t iVar2;
  int32_t kind_local;
  UnicodeString *canonicalFallbackID_local;
  UnicodeString *canonicalPrimaryID_local;
  UnicodeString *primaryID_local;
  LocaleKey *this_local;
  
  ICUServiceKey::ICUServiceKey(&this->super_ICUServiceKey,primaryID);
  (this->super_ICUServiceKey).super_UObject._vptr_UObject = (_func_int **)&PTR__LocaleKey_00504f30;
  this->_kind = kind;
  UnicodeString::UnicodeString(&this->_primaryID,canonicalPrimaryID);
  UnicodeString::UnicodeString(&this->_fallbackID);
  UnicodeString::UnicodeString(&this->_currentID);
  UnicodeString::setToBogus(&this->_fallbackID);
  iVar2 = UnicodeString::length(&this->_primaryID);
  if (((iVar2 != 0) && (canonicalFallbackID != (UnicodeString *)0x0)) &&
     (UVar1 = UnicodeString::operator!=(&this->_primaryID,canonicalFallbackID), UVar1 != '\0')) {
    UnicodeString::operator=(&this->_fallbackID,canonicalFallbackID);
  }
  UnicodeString::operator=(&this->_currentID,&this->_primaryID);
  return;
}

Assistant:

LocaleKey::LocaleKey(const UnicodeString& primaryID,
                     const UnicodeString& canonicalPrimaryID,
                     const UnicodeString* canonicalFallbackID,
                     int32_t kind)
  : ICUServiceKey(primaryID)
  , _kind(kind)
  , _primaryID(canonicalPrimaryID)
  , _fallbackID()
  , _currentID()
{
    _fallbackID.setToBogus();
    if (_primaryID.length() != 0) {
        if (canonicalFallbackID != NULL && _primaryID != *canonicalFallbackID) {
            _fallbackID = *canonicalFallbackID;
        }
    }

    _currentID = _primaryID;
}